

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cpp
# Opt level: O2

void __thiscall Camera::ProcessKeyboard(Camera *this,Camera_Movement direction,GLfloat deltaTime)

{
  vec<3,_float,_(glm::qualifier)0> *pvVar1;
  float scalar;
  vec<3,_float,_(glm::qualifier)0> local_18;
  
  if (CAM_RIGHT < direction) {
    return;
  }
  scalar = deltaTime * this->MovementSpeed;
  switch(direction) {
  case CAM_FORWARD:
    pvVar1 = &this->Front;
    break;
  case CAM_BACKWARD:
    pvVar1 = &this->Front;
    goto LAB_001131d6;
  case CAM_LEFT:
    pvVar1 = &this->Right;
LAB_001131d6:
    local_18 = glm::operator*(pvVar1,scalar);
    glm::vec<3,float,(glm::qualifier)0>::operator-=
              ((vec<3,float,(glm::qualifier)0> *)this,&local_18);
    return;
  case CAM_RIGHT:
    pvVar1 = &this->Right;
  }
  local_18 = glm::operator*(pvVar1,scalar);
  glm::vec<3,float,(glm::qualifier)0>::operator+=((vec<3,float,(glm::qualifier)0> *)this,&local_18);
  return;
}

Assistant:

void Camera::ProcessKeyboard(Camera_Movement direction, GLfloat deltaTime) {
    GLfloat velocity = MovementSpeed * deltaTime;
    if (direction == CAM_FORWARD) {
        Position += Front * velocity;
    }
    if (direction == CAM_BACKWARD) {
        Position -= Front * velocity;
    }
    if (direction == CAM_LEFT) {
        Position -= Right * velocity;
    }
    if (direction == CAM_RIGHT) {
        Position += Right * velocity;
    }
}